

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objloader.cpp
# Opt level: O2

MeshData ObjLoader::loadOBJ(string *filePath,bool *succes)

{
  undefined2 uVar1;
  FILE *pFVar2;
  int iVar3;
  ResourceManager *pRVar4;
  FILE *pFVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  ulong uVar9;
  MeshData MVar10;
  MeshData MVar11;
  undefined1 local_698 [8];
  vec3 vertex;
  undefined1 local_2a8 [8];
  char lineHeader [128];
  string local_220;
  string local_200;
  size_type *local_1e0;
  string vertex3;
  string vertex2;
  undefined1 auStack_188 [8];
  vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
  temp_vertices;
  undefined1 auStack_168 [8];
  vector<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
  temp_uvs;
  undefined1 auStack_148 [8];
  vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
  temp_normals;
  undefined1 auStack_128 [8];
  vector<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
  out_uvs;
  undefined1 auStack_108 [8];
  vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
  out_normals;
  undefined1 auStack_e8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> uvIndices;
  undefined1 auStack_c8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> normalIndices;
  undefined1 auStack_a8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> vertexIndices;
  undefined1 auStack_88 [8];
  vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
  out_vertices;
  value_type_conflict1 local_68;
  uint vertexIndex [3];
  uint uvIndex [3];
  uint normalIndex [3];
  MeshData meshData;
  
  *succes = false;
  pRVar4 = ResourceManager::getInstance();
  std::__cxx11::string::string((string *)&local_220,(string *)filePath);
  MVar10 = ResourceManager::getMeshData(pRVar4,&local_220,succes);
  unique0x10000cfe = MVar10;
  std::__cxx11::string::~string((string *)&local_220);
  if (*succes == true) {
    uVar9 = MVar10._0_8_ & 0xffffffff00000000;
  }
  else {
    vertex2.field_2._8_8_ = succes;
    printf("Loading OBJ file %s...\n",(filePath->_M_dataplus)._M_p);
    auStack_a8 = (undefined1  [8])0x0;
    vertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vertexIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_e8 = (undefined1  [8])0x0;
    uvIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    uvIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_c8 = (undefined1  [8])0x0;
    normalIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    normalIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_188 = (undefined1  [8])0x0;
    temp_vertices.
    super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    temp_vertices.
    super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_168 = (undefined1  [8])0x0;
    temp_uvs.
    super__Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    temp_uvs.
    super__Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_148 = (undefined1  [8])0x0;
    temp_normals.
    super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    temp_normals.
    super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_88 = (undefined1  [8])0x0;
    out_vertices.
    super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    out_vertices.
    super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_128 = (undefined1  [8])0x0;
    out_uvs.
    super__Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    out_uvs.
    super__Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_108 = (undefined1  [8])0x0;
    out_normals.
    super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    out_normals.
    super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pFVar5 = fopen((filePath->_M_dataplus)._M_p,"r");
    pFVar2 = pFVar5;
    if (pFVar5 != (FILE *)0x0) {
LAB_001551ae:
      while( true ) {
        meshData._8_8_ = pFVar2;
        iVar3 = __isoc99_fscanf(pFVar5,"%s",local_2a8);
        if (iVar3 == -1) break;
        uVar1 = local_2a8._0_2_;
        if (local_2a8._0_2_ == 0x76) {
          local_698 = (undefined1  [8])0x0;
          vertex.field_0._0_8_ = vertex.field_0._0_8_ & 0xffffffff00000000;
          __isoc99_fscanf(pFVar5,"%f %f %f\n",(value_type *)local_698,local_698 + 4,&vertex);
          std::
          vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
          ::push_back((vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                       *)auStack_188,(value_type *)local_698);
          pFVar2 = (FILE *)meshData._8_8_;
        }
        else {
          iVar3 = bcmp(local_2a8,"vt",3);
          if (iVar3 == 0) {
            local_698 = (undefined1  [8])0x0;
            __isoc99_fscanf(meshData._8_8_,"%f %f\n",(value_type *)local_698);
            local_698 = (undefined1  [8])((ulong)local_698 ^ 0x8000000000000000);
            std::
            vector<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
            ::push_back((vector<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
                         *)auStack_168,(value_type *)local_698);
            pFVar5 = (FILE *)meshData._8_8_;
            pFVar2 = (FILE *)meshData._8_8_;
          }
          else {
            iVar3 = bcmp(local_2a8,"vn",3);
            pFVar5 = (FILE *)meshData._8_8_;
            if (iVar3 == 0) {
              local_698 = (undefined1  [8])0x0;
              vertex.field_0._0_8_ = vertex.field_0._0_8_ & 0xffffffff00000000;
              __isoc99_fscanf(meshData._8_8_,"%f %f %f\n",(value_type *)local_698,local_698 + 4,
                              &vertex);
              std::
              vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
              ::push_back((vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                           *)auStack_148,(value_type *)local_698);
              pFVar5 = (FILE *)meshData._8_8_;
              pFVar2 = (FILE *)meshData._8_8_;
            }
            else {
              if (uVar1 == 0x66) goto code_r0x00155267;
              fgets(local_698,1000,(FILE *)meshData._8_8_);
              pFVar2 = (FILE *)meshData._8_8_;
            }
          }
        }
      }
      for (uVar8 = 0; uVar9 = (ulong)uVar8,
          uVar9 < (ulong)((long)vertexIndices.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start - (long)auStack_a8 >> 2);
          uVar8 = uVar8 + 1) {
        local_698 = *(undefined1 (*) [8])
                     &((pointer)
                      ((long)auStack_188 +
                      (ulong)(*(pointer)((long)auStack_a8 + uVar9 * 4) - 1) * 0xc))->field_0;
        vertex.field_0.field_0.x =
             (((pointer)
              ((long)auStack_188 + (ulong)(*(pointer)((long)auStack_a8 + uVar9 * 4) - 1) * 0xc))->
             field_0).field_0.z;
        vertex3.field_2._8_8_ =
             *(anon_union_8_3_e2189aaa_for_tvec2<float,_(glm::precision)0>_2 *)
              ((long)auStack_168 + (ulong)(*(pointer)((long)auStack_e8 + uVar9 * 4) - 1) * 8);
        local_2a8 = *(undefined1 (*) [8])
                     &((pointer)
                      ((long)auStack_148 +
                      (ulong)(*(pointer)((long)auStack_c8 + uVar9 * 4) - 1) * 0xc))->field_0;
        lineHeader._0_4_ =
             (((pointer)
              ((long)auStack_148 + (ulong)(*(pointer)((long)auStack_c8 + uVar9 * 4) - 1) * 0xc))->
             field_0).field_0.z;
        std::
        vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
        ::push_back((vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                     *)auStack_88,(value_type *)local_698);
        std::
        vector<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
        ::push_back((vector<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
                     *)auStack_128,(value_type *)((long)&vertex3.field_2 + 8));
        std::
        vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
        ::push_back((vector<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                     *)auStack_108,(value_type *)local_2a8);
      }
      *(undefined1 *)vertex2.field_2._8_8_ = 1;
      (*__glewBindVertexArray)(MVar10.vertexBuffer);
      (*__glewGenBuffers)(1,normalIndex + 1);
      (*__glewBindBuffer)(0x8892,normalIndex[1]);
      (*__glewBufferData)(0x8892,(long)out_vertices.
                                       super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start - (long)auStack_88,
                          (void *)auStack_88,0x88e4);
      (*__glewGenBuffers)(1,&meshData.vertexBuffer);
      (*__glewBindBuffer)(0x8892,meshData.vertexBuffer);
      (*__glewBufferData)(0x8892,(long)out_uvs.
                                       super__Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start - (long)auStack_128
                          ,(void *)auStack_128,0x88e4);
      (*__glewGenBuffers)(1,normalIndex + 2);
      (*__glewBindBuffer)(0x8892,normalIndex[2]);
      (*__glewBufferData)(0x8892,(long)out_normals.
                                       super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start - (long)auStack_108
                          ,(void *)auStack_108,0x88e4);
      meshData.normalBuffer =
           (int)(((long)out_vertices.
                        super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start - (long)auStack_88) / 0xc);
      pRVar4 = ResourceManager::getInstance();
      MVar10 = stack0xffffffffffffffb8;
      std::__cxx11::string::string((string *)&local_200,(string *)filePath);
      ResourceManager::addMeshData(pRVar4,MVar10,&local_200);
      std::__cxx11::string::~string((string *)&local_200);
      uVar9 = normalIndex._4_8_ & 0xffffffff00000000;
      uVar6 = meshData._0_8_;
      uVar7 = normalIndex._4_8_;
      goto LAB_00155709;
    }
    printf("Impossible to open the file ! Are you in the right path ?");
    getchar();
LAB_00155704:
    uVar9 = 0xffffffff00000000;
    uVar7._0_4_ = 0xffffffff;
    uVar7._4_4_ = 0;
    uVar6._0_4_ = 0xffffffff;
    uVar6._4_4_ = 0;
LAB_00155709:
    MVar10.uvBuffer = (GLuint)uVar6;
    MVar10.numVerts = SUB84(uVar6,4);
    MVar10.vertexBuffer = (uint)uVar7;
    MVar10.normalBuffer = SUB84(uVar7,4);
    std::
    _Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
    ::~_Vector_base((_Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                     *)auStack_108);
    std::
    _Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
    ::~_Vector_base((_Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
                     *)auStack_128);
    std::
    _Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
    ::~_Vector_base((_Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                     *)auStack_88);
    std::
    _Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
    ::~_Vector_base((_Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                     *)auStack_148);
    std::
    _Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
    ::~_Vector_base((_Vector_base<glm::tvec2<float,_(glm::precision)0>,_std::allocator<glm::tvec2<float,_(glm::precision)0>_>_>
                     *)auStack_168);
    std::
    _Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
    ::~_Vector_base((_Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                     *)auStack_188);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_c8);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_e8);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_a8);
  }
  MVar11._0_8_ = MVar10._0_8_ & 0xffffffff | uVar9;
  MVar11.uvBuffer = (int)MVar10._8_8_;
  MVar11.numVerts = (int)((ulong)MVar10._8_8_ >> 0x20);
  return MVar11;
code_r0x00155267:
  local_698 = (undefined1  [8])((long)&vertex.field_0 + 8);
  vertex.field_0._0_8_ = 0;
  vertex3.field_2._8_8_ = &vertex2._M_string_length;
  vertex2._M_dataplus._M_p = (pointer)0x0;
  vertex.field_0._8_1_ = 0;
  vertex2._M_string_length._0_1_ = 0;
  local_1e0 = &vertex3._M_string_length;
  vertex3._M_dataplus._M_p = (pointer)0x0;
  vertex3._M_string_length._0_1_ = 0;
  iVar3 = __isoc99_fscanf(meshData._8_8_,"%d/%d/%d %d/%d/%d %d/%d/%d\n",
                          (undefined1 *)
                          ((long)&out_vertices.
                                  super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                          vertexIndex + 1,uvIndex + 1,&local_68,vertexIndex + 2,uvIndex + 2,
                          vertexIndex,uvIndex,normalIndex);
  if (iVar3 == 9) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_a8,
               (value_type_conflict1 *)
               ((long)&out_vertices.
                       super__Vector_base<glm::tvec3<float,_(glm::precision)0>,_std::allocator<glm::tvec3<float,_(glm::precision)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_a8,&local_68);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_a8,vertexIndex);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_e8,vertexIndex + 1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_e8,vertexIndex + 2);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_e8,uvIndex);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_c8,uvIndex + 1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_c8,uvIndex + 2);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_c8,normalIndex);
  }
  else {
    puts("File can\'t be read by this simple parser :-( Try exporting with other options");
  }
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)(vertex3.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_698);
  pFVar2 = (FILE *)meshData._8_8_;
  if (iVar3 != 9) goto LAB_00155704;
  goto LAB_001551ae;
}

Assistant:

MeshData ObjLoader::loadOBJ(std::string filePath, bool &succes)
{
	succes = false;
	MeshData meshData = ResourceManager::getInstance()->getMeshData(filePath, succes);
	if (succes)
	{
		return meshData;
	}
	printf("Loading OBJ file %s...\n", filePath.c_str());

	std::vector<unsigned int> vertexIndices, uvIndices, normalIndices;
	std::vector<glm::vec3> temp_vertices;
	std::vector<glm::vec2> temp_uvs;
	std::vector<glm::vec3> temp_normals;

	std::vector<glm::vec3> out_vertices;
	std::vector<glm::vec2> out_uvs;
	std::vector<glm::vec3> out_normals;


	FILE * file = fopen(filePath.c_str(), "r");
	if (file == NULL)
	{
		printf("Impossible to open the file ! Are you in the right path ?");
		getchar();
		return MeshData();
	}

	while (1)
	{

		char lineHeader[128];
		// read the first word of the line
		int res = fscanf(file, "%s", lineHeader);
		if (res == EOF)
			break; // EOF = End Of File. Quit the loop.

		// else : parse lineHeader

		if (strcmp(lineHeader, "v") == 0)
		{
			glm::vec3 vertex;
			fscanf(file, "%f %f %f\n", &vertex.x, &vertex.y, &vertex.z);
			temp_vertices.push_back(vertex);
		}
		else if (strcmp(lineHeader, "vt") == 0)
		{
			glm::vec2 uv;
			fscanf(file, "%f %f\n", &uv.x, &uv.y);
			uv.y = -uv.y; // Invert V coordinate since we will only use DDS texture, which are inverted. Remove if you want to use TGA or BMP loaders.
			temp_uvs.push_back(uv);
		}
		else if (strcmp(lineHeader, "vn") == 0)
		{
			glm::vec3 normal;
			fscanf(file, "%f %f %f\n", &normal.x, &normal.y, &normal.z);
			temp_normals.push_back(normal);
		}
		else if (strcmp(lineHeader, "f") == 0)
		{
			std::string vertex1, vertex2, vertex3;
			unsigned int vertexIndex[3], uvIndex[3], normalIndex[3];
			int matches = fscanf(file, "%d/%d/%d %d/%d/%d %d/%d/%d\n", &vertexIndex[0], &uvIndex[0], &normalIndex[0], &vertexIndex[1], &uvIndex[1], &normalIndex[1], &vertexIndex[2], &uvIndex[2], &normalIndex[2]);
			if (matches != 9)
			{
				printf("File can't be read by this simple parser :-( Try exporting with other options\n");
				return MeshData();
			}
			vertexIndices.push_back(vertexIndex[0]);
			vertexIndices.push_back(vertexIndex[1]);
			vertexIndices.push_back(vertexIndex[2]);
			uvIndices.push_back(uvIndex[0]);
			uvIndices.push_back(uvIndex[1]);
			uvIndices.push_back(uvIndex[2]);
			normalIndices.push_back(normalIndex[0]);
			normalIndices.push_back(normalIndex[1]);
			normalIndices.push_back(normalIndex[2]);
		}
		else
		{
			// Probably a comment, eat up the rest of the line
			char stupidBuffer[1000];
			fgets(stupidBuffer, 1000, file);
		}

	}

	// For each vertex of each triangle
	for (unsigned int i = 0; i < vertexIndices.size(); i++)
	{

		// Get the indices of its attributes
		unsigned int vertexIndex = vertexIndices[i];
		unsigned int uvIndex = uvIndices[i];
		unsigned int normalIndex = normalIndices[i];

		// Get the attributes thanks to the index
		glm::vec3 vertex = temp_vertices[vertexIndex - 1];
		glm::vec2 uv = temp_uvs[uvIndex - 1];
		glm::vec3 normal = temp_normals[normalIndex - 1];

		// Put the attributes in buffers
		out_vertices.push_back(vertex);
		out_uvs.push_back(uv);
		out_normals.push_back(normal);
		
	}
	succes = true;

	glBindVertexArray(meshData.vertexBuffer);
	glGenBuffers(1, &meshData.vertexBuffer);
	glBindBuffer(GL_ARRAY_BUFFER, meshData.vertexBuffer);
	glBufferData(GL_ARRAY_BUFFER, out_vertices.size() * sizeof(glm::vec3), &out_vertices[0], GL_STATIC_DRAW);

	glGenBuffers(1, &meshData.uvBuffer);
	glBindBuffer(GL_ARRAY_BUFFER, meshData.uvBuffer);
	glBufferData(GL_ARRAY_BUFFER, out_uvs.size() * sizeof(glm::vec2), &out_uvs[0], GL_STATIC_DRAW);

	glGenBuffers(1, &meshData.normalBuffer);
	glBindBuffer(GL_ARRAY_BUFFER, meshData.normalBuffer);
	glBufferData(GL_ARRAY_BUFFER, out_normals.size() * sizeof(glm::vec3), &out_normals[0], GL_STATIC_DRAW);
	
	meshData.numVerts = out_vertices.size();
	ResourceManager::getInstance()->addMeshData(meshData, filePath);
	return meshData;
}